

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_copy_image2cell
              (fitsfile *fptr,fitsfile *newptr,char *colname,long rownum,int copykeyflag,int *status
              )

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int *status_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  fitsfile *in_RDI;
  int in_R8D;
  fitsfile *in_R9;
  char *patterns [43] [2];
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  uchar dummy;
  int typecode1;
  LONGLONG width1;
  LONGLONG repeat1;
  LONGLONG naxes1 [9];
  int naxis1;
  int npat;
  char filename [1045];
  LONGLONG firstbyte;
  LONGLONG ntodo;
  LONGLONG repeat;
  LONGLONG nbytes;
  LONGLONG naxes [9];
  LONGLONG imgstart;
  char card [81];
  char tform [20];
  char tformchar;
  int hdunum;
  int ncols;
  int naxis;
  int bitpix;
  int typecode;
  int colnum;
  int hdutype;
  int ii;
  uchar buffer [30000];
  tcolumn *colptr;
  LONGLONG *in_stack_ffffffffffff81d8;
  int *status_01;
  int *in_stack_ffffffffffff81e0;
  fitsfile *fptr_00;
  fitsfile *in_stack_ffffffffffff81e8;
  fitsfile *in_stack_ffffffffffff81f0;
  undefined4 in_stack_ffffffffffff81f8;
  int in_stack_ffffffffffff81fc;
  fitsfile *in_stack_ffffffffffff8200;
  int *in_stack_ffffffffffff8208;
  void *in_stack_ffffffffffff8210;
  fitsfile *in_stack_ffffffffffff8218;
  char *pcVar4;
  int *in_stack_ffffffffffff8220;
  int *in_stack_ffffffffffff8228;
  char *in_stack_ffffffffffff8230;
  undefined4 in_stack_ffffffffffff8238;
  int in_stack_ffffffffffff823c;
  fitsfile *in_stack_ffffffffffff8240;
  uchar *in_stack_ffffffffffff8248;
  LONGLONG in_stack_ffffffffffff8250;
  LONGLONG in_stack_ffffffffffff8258;
  LONGLONG in_stack_ffffffffffff8260;
  fitsfile *in_stack_ffffffffffff8268;
  int *in_stack_ffffffffffff8288;
  LONGLONG *in_stack_ffffffffffff8290;
  int *in_stack_ffffffffffff8298;
  int in_stack_ffffffffffff82a0;
  int in_stack_ffffffffffff82a4;
  fitsfile *in_stack_ffffffffffff82a8;
  int *in_stack_ffffffffffff82e0;
  fitsfile *in_stack_ffffffffffff82e8;
  int in_stack_ffffffffffff82f8;
  int in_stack_ffffffffffff82fc;
  char *(*in_stack_ffffffffffff8300) [2];
  int in_stack_ffffffffffff830c;
  fitsfile *in_stack_ffffffffffff8310;
  fitsfile *in_stack_ffffffffffff8318;
  int in_stack_ffffffffffff8350;
  int in_stack_ffffffffffff8358;
  int *in_stack_ffffffffffff8360;
  int *in_stack_ffffffffffff83a0;
  LONGLONG *in_stack_ffffffffffff83a8;
  int in_stack_ffffffffffff83b0;
  int in_stack_ffffffffffff83b4;
  fitsfile *in_stack_ffffffffffff83b8;
  undefined1 local_7b0d;
  int local_7b0c;
  FITSfile *local_7b00;
  long local_7af8 [9];
  int local_7ab0;
  undefined4 local_7aac;
  char local_7aa8 [1056];
  long local_7688;
  FITSfile *local_7680;
  FITSfile *local_7678;
  FITSfile *local_7670;
  long local_7668 [10];
  char local_7618 [96];
  char local_75b8 [31];
  char local_7599;
  int local_7598;
  int local_7594;
  int local_7590;
  int local_758c;
  int local_7588;
  int local_7584;
  int local_7580;
  int local_757c;
  long local_40;
  fitsfile *local_38;
  int local_2c;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  fitsfile *local_10;
  int local_4;
  
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_7af8,0,0x48);
  local_7b0d = 0;
  memcpy(&stack0xffffffffffff8228,&PTR_anon_var_dwarf_683_00292030,0x2b0);
  if (local_38->HDUposition < 1) {
    if ((local_10 == (fitsfile *)0x0) || (local_18 == 0)) {
      local_38->HDUposition = 0x73;
      local_4 = 0x73;
    }
    else {
      iVar2 = ffghdt(in_stack_ffffffffffff81e8,in_stack_ffffffffffff81e0,
                     (int *)in_stack_ffffffffffff81d8);
      if (iVar2 < 1) {
        if (local_7580 == 0) {
          iVar2 = ffghdt(in_stack_ffffffffffff81e8,in_stack_ffffffffffff81e0,
                         (int *)in_stack_ffffffffffff81d8);
          if (iVar2 < 1) {
            if (local_7580 == 2) {
              iVar2 = ffgiprll((fitsfile *)
                               CONCAT44(in_stack_ffffffffffff81fc,in_stack_ffffffffffff81f8),
                               (int)((ulong)in_stack_ffffffffffff81f0 >> 0x20),
                               &in_stack_ffffffffffff81e8->HDUposition,in_stack_ffffffffffff81e0,
                               in_stack_ffffffffffff81d8,(int *)0x11b7ae);
              if (iVar2 < 1) {
                local_7678 = (FITSfile *)0x1;
                for (local_757c = 0; local_757c < local_7590; local_757c = local_757c + 1) {
                  local_7678 = (FITSfile *)(local_7668[local_757c] * (long)local_7678);
                }
                if (local_758c == 8) {
                  local_7588 = 0xb;
                  local_7599 = 'B';
                  local_7670 = local_7678;
                }
                else if (local_758c == 0x10) {
                  local_7588 = 0x15;
                  local_7599 = 'I';
                  local_7670 = (FITSfile *)((long)local_7678 << 1);
                }
                else if (local_758c == 0x20) {
                  local_7588 = 0x29;
                  local_7599 = 'J';
                  local_7670 = (FITSfile *)((long)local_7678 << 2);
                }
                else if (local_758c == -0x20) {
                  local_7588 = 0x2a;
                  local_7599 = 'E';
                  local_7670 = (FITSfile *)((long)local_7678 << 2);
                }
                else {
                  if (local_758c == -0x40) {
                    local_7588 = 0x52;
                    local_7599 = 'D';
                  }
                  else {
                    if (local_758c != 0x40) {
                      ffpmsg((char *)0x11b975);
                      local_38->HDUposition = 0xd3;
                      return 0xd3;
                    }
                    local_7588 = 0x51;
                    local_7599 = 'K';
                  }
                  local_7670 = (FITSfile *)((long)local_7678 << 3);
                }
                ffpmrk();
                ffgcno(in_stack_ffffffffffff8240,in_stack_ffffffffffff823c,in_stack_ffffffffffff8230
                       ,in_stack_ffffffffffff8228,in_stack_ffffffffffff8220);
                ffcmrk();
                if (local_38->HDUposition == 0) {
                  ffgtdmll(in_stack_ffffffffffff82a8,in_stack_ffffffffffff82a4,
                           in_stack_ffffffffffff82a0,in_stack_ffffffffffff8298,
                           in_stack_ffffffffffff8290,in_stack_ffffffffffff8288);
                  if ((0 < local_38->HDUposition) || (local_7590 != local_7ab0)) {
                    ffpmsg((char *)0x11bb2d);
                    local_38->HDUposition = 0x140;
                    return 0x140;
                  }
                  for (local_757c = 0; local_757c < local_7590; local_757c = local_757c + 1) {
                    if (local_7668[local_757c] != local_7af8[local_757c]) {
                      ffpmsg((char *)0x11bb94);
                      local_38->HDUposition = 0x140;
                      return 0x140;
                    }
                  }
                  ffgtclll(in_stack_ffffffffffff8218,(int)((ulong)in_stack_ffffffffffff8210 >> 0x20)
                           ,in_stack_ffffffffffff8208,(LONGLONG *)in_stack_ffffffffffff8200,
                           (LONGLONG *)CONCAT44(in_stack_ffffffffffff81fc,in_stack_ffffffffffff81f8)
                           ,&in_stack_ffffffffffff81f0->HDUposition);
                  if (((0 < local_38->HDUposition) || (local_7b0c != local_7588)) ||
                     (local_7b00 != local_7678)) {
                    ffpmsg((char *)0x11bc36);
                    local_38->HDUposition = 0x105;
                    return 0x105;
                  }
                }
                else {
                  local_38->HDUposition = 0;
                  snprintf(local_75b8,0x14,"%.0f%c",(double)(long)local_7678,
                           (ulong)(uint)(int)local_7599);
                  ffgncl(in_stack_ffffffffffff81e8,in_stack_ffffffffffff81e0,
                         (int *)in_stack_ffffffffffff81d8);
                  local_7584 = local_7594 + 1;
                  fficol(in_stack_ffffffffffff8200,in_stack_ffffffffffff81fc,
                         (char *)in_stack_ffffffffffff81f0,(char *)in_stack_ffffffffffff81e8,
                         in_stack_ffffffffffff81e0);
                  ffptdmll(in_stack_ffffffffffff83b8,in_stack_ffffffffffff83b4,
                           in_stack_ffffffffffff83b0,in_stack_ffffffffffff83a8,
                           in_stack_ffffffffffff83a0);
                  if (local_38->HDUposition != 0) {
                    ffpmsg((char *)0x11bab8);
                    return local_38->HDUposition;
                  }
                }
                if (local_2c != 0) {
                  local_7aac = 0x2b;
                  in_stack_ffffffffffff81e8 = local_38;
                  fits_translate_keywords
                            (in_stack_ffffffffffff8318,in_stack_ffffffffffff8310,
                             in_stack_ffffffffffff830c,in_stack_ffffffffffff8300,
                             in_stack_ffffffffffff82fc,in_stack_ffffffffffff82f8,
                             in_stack_ffffffffffff8350,in_stack_ffffffffffff8358,
                             in_stack_ffffffffffff8360);
                }
                status_01 = (int *)&local_7b0d;
                fptr_00 = local_38;
                ffpcl((fitsfile *)CONCAT44(in_stack_ffffffffffff81fc,in_stack_ffffffffffff81f8),
                      (int)((ulong)in_stack_ffffffffffff81f0 >> 0x20),(int)in_stack_ffffffffffff81f0
                      ,(LONGLONG)in_stack_ffffffffffff81e8,(LONGLONG)local_38,(LONGLONG)status_01,
                      in_stack_ffffffffffff8210,&in_stack_ffffffffffff8218->HDUposition);
                local_40 = *(long *)(*(long *)(local_18 + 8) + 0x3d0) +
                           (long)(local_7584 + -1) * 0xa0;
                local_7688 = *(long *)(local_40 + 0x48) + 1;
                ffghadll((fitsfile *)CONCAT44(in_stack_ffffffffffff81fc,in_stack_ffffffffffff81f8),
                         (LONGLONG *)in_stack_ffffffffffff81f0,(LONGLONG *)in_stack_ffffffffffff81e8
                         ,(LONGLONG *)fptr_00,status_01);
                snprintf(local_7618,0x51,"HISTORY  Table column \'%s\' row %ld copied from image",
                         local_20,local_28);
                local_7aa8[0] = '\0';
                local_7598 = 0;
                strcpy(local_7aa8,"HISTORY   ");
                strlen(local_7aa8);
                ffflnm(fptr_00,(char *)status_01,(int *)0x11be5d);
                ffghdn(local_10,&local_7598);
                pcVar4 = local_7aa8;
                sVar3 = strlen(local_7aa8);
                status_00 = (int *)(pcVar4 + sVar3);
                sVar3 = strlen(local_7aa8);
                snprintf((char *)status_00,0x415 - sVar3,"[%d]",(ulong)(local_7598 - 1));
                ffflsh(in_stack_ffffffffffff81f0,(int)((ulong)in_stack_ffffffffffff81e8 >> 0x20),
                       &fptr_00->HDUposition);
                ffmbyt((fitsfile *)CONCAT44(in_stack_ffffffffffff81fc,in_stack_ffffffffffff81f8),
                       (LONGLONG)in_stack_ffffffffffff81f0,
                       (int)((ulong)in_stack_ffffffffffff81e8 >> 0x20),&fptr_00->HDUposition);
                local_7680 = local_7670;
                if (30000 < (long)local_7670) {
                  local_7680 = (FITSfile *)0x7530;
                }
                ffgbyt((fitsfile *)CONCAT44(in_stack_ffffffffffff823c,in_stack_ffffffffffff8238),
                       (LONGLONG)in_stack_ffffffffffff8230,in_stack_ffffffffffff8228,status_00);
                ffptbb(in_stack_ffffffffffff8268,in_stack_ffffffffffff8260,in_stack_ffffffffffff8258
                       ,in_stack_ffffffffffff8250,in_stack_ffffffffffff8248,
                       &in_stack_ffffffffffff8240->HDUposition);
                local_7670 = (FITSfile *)((long)local_7670 - (long)local_7680);
                local_7688 = (long)&local_7680->filehandle + local_7688;
                while( true ) {
                  bVar1 = false;
                  if (local_7670 != (FITSfile *)0x0) {
                    bVar1 = local_38->HDUposition < 1;
                  }
                  if (!bVar1) break;
                  local_7680 = local_7670;
                  if (30000 < (long)local_7670) {
                    local_7680 = (FITSfile *)0x7530;
                  }
                  ffread(local_7680,(long)in_stack_ffffffffffff81e8,fptr_00,status_01);
                  ffptbb(in_stack_ffffffffffff8268,in_stack_ffffffffffff8260,
                         in_stack_ffffffffffff8258,in_stack_ffffffffffff8250,
                         in_stack_ffffffffffff8248,&in_stack_ffffffffffff8240->HDUposition);
                  local_7670 = (FITSfile *)((long)local_7670 - (long)local_7680);
                  local_7688 = (long)&local_7680->filehandle + local_7688;
                }
                ffrdef(in_stack_ffffffffffff82e8,in_stack_ffffffffffff82e0);
                local_4 = local_38->HDUposition;
              }
              else {
                ffpmsg((char *)0x11b7bf);
                local_4 = local_38->HDUposition;
              }
            }
            else {
              ffpmsg((char *)0x11b75e);
              local_38->HDUposition = 0xe3;
              local_4 = 0xe3;
            }
          }
          else {
            ffpmsg((char *)0x11b732);
            local_4 = local_38->HDUposition;
          }
        }
        else {
          ffpmsg((char *)0x11b6da);
          ffpmsg((char *)0x11b6e6);
          local_38->HDUposition = 0xe9;
          local_4 = 0xe9;
        }
      }
      else {
        ffpmsg((char *)0x11b6ae);
        local_4 = local_38->HDUposition;
      }
    }
  }
  else {
    local_4 = local_38->HDUposition;
  }
  return local_4;
}

Assistant:

int fits_copy_image2cell(
	   fitsfile *fptr,   /* I - pointer to input image extension */
	   fitsfile *newptr, /* I - pointer to output table */
           char *colname,    /* I - name of column containing the image    */
           long rownum,      /* I - number of the row containing the image */
           int copykeyflag,  /* I - controls which keywords to copy */
           int *status)      /* IO - error status */

/* 
   Copy an image extension into a table cell at a given row and
   column.  The table must have already been created.  If the "colname"
   column exists, it will be used, otherwise a new column will be created
   in the table.

   The "copykeyflag" parameter controls which keywords to copy from the 
   input image to the output table header (with any appropriate translation).
 
   copykeyflag = 0  -- no keywords will be copied
   copykeyflag = 1  -- essentially all keywords will be copied
   copykeyflag = 2  -- copy only the WCS related keywords 
   
  This routine was written by Craig Markwardt, GSFC

*/
{
    tcolumn *colptr;
    unsigned char buffer[30000];
    int ii, hdutype, colnum, typecode, bitpix, naxis, ncols, hdunum;
    char tformchar, tform[20], card[FLEN_CARD];
    LONGLONG imgstart, naxes[9], nbytes, repeat, ntodo,firstbyte;
    char filename[FLEN_FILENAME+20];

    int npat;

    int naxis1;
    LONGLONG naxes1[9] = {0,0,0,0,0,0,0,0,0}, repeat1, width1;
    int typecode1;
    unsigned char dummy = 0;

    LONGLONG headstart, datastart, dataend;

    /* Image-to-table keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */
    char *patterns[][2] = {{"BSCALE",  "TSCALn"  },  /* Standard FITS keywords */
			   {"BZERO",   "TZEROn"  },
			   {"BUNIT",   "TUNITn"  },
			   {"BLANK",   "TNULLn"  },
			   {"DATAMIN", "TDMINn"  },
			   {"DATAMAX", "TDMAXn"  },
			   {"CTYPEi",  "iCTYPn"  },  /* Coordinate labels */
			   {"CTYPEia", "iCTYna"  },
			   {"CUNITi",  "iCUNIn"  },  /* Coordinate units */
			   {"CUNITia", "iCUNna"  },
			   {"CRVALi",  "iCRVLn"  },  /* WCS keywords */
			   {"CRVALia", "iCRVna"  },
			   {"CDELTi",  "iCDLTn"  },
			   {"CDELTia", "iCDEna"  },
			   {"CRPIXj",  "jCRPXn"  },
			   {"CRPIXja", "jCRPna"  },
			   {"PCi_ja",  "ijPCna"  },
			   {"CDi_ja",  "ijCDna"  },
			   {"PVi_ma",  "iVn_ma"  },
			   {"PSi_ma",  "iSn_ma"  },
			   {"WCSAXESa","WCAXna"  },
			   {"WCSNAMEa","WCSNna"  },
			   {"CRDERia", "iCRDna"  },
			   {"CSYERia", "iCSYna"  },
			   {"CROTAi",  "iCROTn"  },

			   {"LONPOLEa","LONPna"},
			   {"LATPOLEa","LATPna"},
			   {"EQUINOXa","EQUIna"},
			   {"MJD-OBS", "MJDOBn" },
			   {"MJD-AVG", "MJDAn" },
			   {"RADESYSa","RADEna"},
			   {"CNAMEia", "iCNAna"  },
			   {"DATE-AVG","DAVGn"},

			   {"NAXISi",  "-"       },  /* Remove structural keywords*/
			   {"PCOUNT",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"EXTEND",  "-"       },
			   {"EXTNAME", "-"       },
			   {"EXTVER",  "-"       },
			   {"EXTLEVEL","-"       },
			   {"CHECKSUM","-"       },
			   {"DATASUM", "-"       },
			   {"*",       "+"       }}; /* copy all other keywords */

    
    if (*status > 0)
        return(*status);

    if (fptr == 0 || newptr == 0) return (*status = NULL_INPUT_PTR);

    if (ffghdt(fptr, &hdutype, status) > 0) {
      ffpmsg("could not get input HDU type");
      return (*status);
    }

    if (hdutype != IMAGE_HDU) {
        ffpmsg("The input extension is not an image.");
        ffpmsg(" Cannot open the image.");
        return(*status = NOT_IMAGE);
    }

    if (ffghdt(newptr, &hdutype, status) > 0) {
      ffpmsg("could not get output HDU type");
      return (*status);
    }

    if (hdutype != BINARY_TBL) {
        ffpmsg("The output extension is not a table.");
        return(*status = NOT_BTABLE);
    }


    if (ffgiprll(fptr, 9, &bitpix, &naxis, naxes, status) > 0) {
      ffpmsg("Could not read image parameters.");
      return (*status);
    }

    /* Determine total number of pixels in the image */
    repeat = 1;
    for (ii = 0; ii < naxis; ii++) repeat *= naxes[ii];

    /* Determine the TFORM value for the table cell */
    if (bitpix == BYTE_IMG) {
      typecode = TBYTE;
      tformchar = 'B';
      nbytes = repeat;
    } else if (bitpix == SHORT_IMG) {
      typecode = TSHORT;
      tformchar = 'I';
      nbytes = repeat*2;
    } else if (bitpix == LONG_IMG) {
      typecode = TLONG;
      tformchar = 'J';
      nbytes = repeat*4;
    } else if (bitpix == FLOAT_IMG) {
      typecode = TFLOAT;
      tformchar = 'E';
      nbytes = repeat*4;
    } else if (bitpix == DOUBLE_IMG) {
      typecode = TDOUBLE;
      tformchar = 'D';
      nbytes = repeat*8;
    } else if (bitpix == LONGLONG_IMG) {
      typecode = TLONGLONG;
      tformchar = 'K';
      nbytes = repeat*8;
    } else {
      ffpmsg("Error: the image has an invalid datatype.");
      return (*status = BAD_BITPIX);
    }

    /* get column number */
    ffpmrk();
    ffgcno(newptr, CASEINSEN, colname, &colnum, status);
    ffcmrk();

    /* Column does not exist; create it */
    if (*status) {

      *status = 0;
      snprintf(tform, 20, "%.0f%c", (double) repeat, tformchar);
      ffgncl(newptr, &ncols, status);
      colnum = ncols+1;
      fficol(newptr, colnum, colname, tform, status);
      ffptdmll(newptr, colnum, naxis, naxes, status);
      
      if (*status) {
	ffpmsg("Could not insert new column into output table.");
	return *status;
      }

    } else {

      ffgtdmll(newptr, colnum, 9, &naxis1, naxes1, status);
      if (*status > 0 || naxis != naxis1) {
	ffpmsg("Input image dimensions and output table cell dimensions do not match.");
	return (*status = BAD_DIMEN);
      }
      for (ii=0; ii<naxis; ii++) if (naxes[ii] != naxes1[ii]) {
	ffpmsg("Input image dimensions and output table cell dimensions do not match.");
	return (*status = BAD_DIMEN);
      }

      ffgtclll(newptr, colnum, &typecode1, &repeat1, &width1, status);
      if ((*status > 0) || (typecode1 != typecode) || (repeat1 != repeat)) {
	ffpmsg("Input image data type does not match output table cell type.");
	return (*status = BAD_TFORM);
      }
    }

    /* copy keywords from input image to output table, if required */
    
    if (copykeyflag) {
    
      npat = sizeof(patterns)/sizeof(patterns[0][0])/2;

      if (copykeyflag == 2) {   /* copy only the WCS-related keywords */
	patterns[npat-1][1] = "-";
      }

      /* The 3rd parameter value = 5 means skip the first 4 keywords in the image */
      fits_translate_keywords(fptr, newptr, 5, patterns, npat,
			      colnum, 0, 0, status);
    }

    /* Here is all the code to compute offsets:
     *     * byte offset from start of row to column (dest table)
     *     * byte offset from start of file to image data (source image)
     */   
 
    /* Force the writing of the row of the table by writing the last byte of
        the array, which grows the table, and/or shifts following extensions */
    ffpcl(newptr, TBYTE, colnum, rownum, repeat, 1, &dummy, status);

    /* byte offset within the row to the start of the image column */
    colptr  = (newptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    firstbyte = colptr->tbcol + 1; 

    /* get starting address of input image to be read */
    ffghadll(fptr, &headstart, &datastart, &dataend, status);
    imgstart = datastart;

    snprintf(card, FLEN_CARD, "HISTORY  Table column '%s' row %ld copied from image",
	    colname, rownum);
/*
  Don't automatically write History keywords; leave this up to the caller. 
    ffprec(newptr, card, status);
*/

    /* write HISTORY keyword with the file name (this is now disabled)*/

    filename[0] = '\0'; hdunum = 0;
    strcpy(filename, "HISTORY   ");
    ffflnm(fptr, filename+strlen(filename), status);
    ffghdn(fptr, &hdunum);
    snprintf(filename+strlen(filename),FLEN_FILENAME+20-strlen(filename),"[%d]", hdunum-1);
/*
    ffprec(newptr, filename, status);
*/

    /* the use of ffread routine, below, requires that any 'dirty' */
    /* buffers in memory be flushed back to the file first */
    
    ffflsh(fptr, FALSE, status);

    /* move to the first byte of the input image */
    ffmbyt(fptr, imgstart, TRUE, status);

    ntodo = minvalue(30000L, nbytes);
    ffgbyt(fptr, ntodo, buffer, status);  /* read input image */
    ffptbb(newptr, rownum, firstbyte, ntodo, buffer, status); /* write to table */

    nbytes    -= ntodo;
    firstbyte += ntodo;


    /* read any additional bytes with low-level ffread routine, for speed */
    while (nbytes && (*status <= 0) )
    {
        ntodo = minvalue(30000L, nbytes);
        ffread(fptr->Fptr, (long) ntodo, buffer, status);
        ffptbb(newptr, rownum, firstbyte, ntodo, buffer, status);
        nbytes    -= ntodo;
        firstbyte += ntodo;
    }

    /* Re-scan the header so that CFITSIO knows about all the new keywords */
    ffrdef(newptr,status);

    return(*status);
}